

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sys_Event.h
# Opt level: O3

__pid_t __thiscall
axl::sys::CondMutexEventBase<axl::sl::False>::wait
          (CondMutexEventBase<axl::sl::False> *this,void *__stat_loc)

{
  Mutex *__mutex;
  __pid_t _Var1;
  
  __mutex = &(this->m_condMutexPair).m_mutex;
  pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (this->m_state == false) {
    _Var1 = psx::Cond::wait((Cond *)this,__mutex);
    if ((char)_Var1 == '\0') {
      _Var1 = 0;
      goto LAB_0014f025;
    }
  }
  this->m_state = false;
  _Var1 = (__pid_t)CONCAT71((uint7)((ulong)__stat_loc >> 8) & 0xffffff,1);
LAB_0014f025:
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  return _Var1;
}

Assistant:

bool
	wait(uint_t timeout = -1) {
		m_condMutexPair.lock();

		if (m_state) {
			if (!IsNotificationEvent()())
				m_state = false;

			m_condMutexPair.unlock();
			return true;
		}

		bool result = m_condMutexPair.wait(timeout);
		if (!result) {
			m_condMutexPair.unlock();
			return false;
		}

		if (!IsNotificationEvent()())
			m_state = false;

		m_condMutexPair.unlock();
		return true;
	}